

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListDup(sqlite3 *db,ExprList *p,int flags)

{
  Expr *p_00;
  int iVar1;
  Expr *pEVar2;
  char *pcVar3;
  Expr *pNewExpr;
  Expr *pOldExpr;
  Expr *pPriorSelectColNew;
  Expr *pPriorSelectColOld;
  ExprList_item *pEStack_40;
  int i;
  ExprList_item *pOldItem;
  ExprList_item *pItem;
  ExprList *pNew;
  int flags_local;
  ExprList *p_local;
  sqlite3 *db_local;
  
  pPriorSelectColNew = (Expr *)0x0;
  pOldExpr = (Expr *)0x0;
  if (p == (ExprList *)0x0) {
    db_local = (sqlite3 *)0x0;
  }
  else {
    iVar1 = sqlite3DbMallocSize(db,p);
    db_local = (sqlite3 *)sqlite3DbMallocRawNN(db,(long)iVar1);
    if (db_local == (sqlite3 *)0x0) {
      db_local = (sqlite3 *)0x0;
    }
    else {
      *(int *)&db_local->pVfs = p->nExpr;
      *(int *)((long)&db_local->pVfs + 4) = p->nAlloc;
      pOldItem = (ExprList_item *)&db_local->pVdbe;
      pEStack_40 = p->a;
      for (pPriorSelectColOld._4_4_ = 0; pPriorSelectColOld._4_4_ < p->nExpr;
          pPriorSelectColOld._4_4_ = pPriorSelectColOld._4_4_ + 1) {
        p_00 = pEStack_40->pExpr;
        pEVar2 = sqlite3ExprDup(db,p_00,flags);
        pOldItem->pExpr = pEVar2;
        if (((p_00 != (Expr *)0x0) && (p_00->op == 0xb2)) &&
           (pEVar2 = pOldItem->pExpr, pEVar2 != (Expr *)0x0)) {
          if (pEVar2->pRight == (Expr *)0x0) {
            if (p_00->pLeft != pPriorSelectColNew) {
              pPriorSelectColNew = p_00->pLeft;
              pOldExpr = sqlite3ExprDup(db,pPriorSelectColNew,flags);
              pEVar2->pRight = pOldExpr;
            }
            pEVar2->pLeft = pOldExpr;
          }
          else {
            pPriorSelectColNew = p_00->pRight;
            pOldExpr = pEVar2->pRight;
            pEVar2->pLeft = pEVar2->pRight;
          }
        }
        pcVar3 = sqlite3DbStrDup(db,pEStack_40->zEName);
        pOldItem->zEName = pcVar3;
        pOldItem->fg = pEStack_40->fg;
        *(ushort *)&(pOldItem->fg).field_0x1 = *(ushort *)&(pOldItem->fg).field_0x1 & 0xfffb;
        pOldItem->u = pEStack_40->u;
        pOldItem = pOldItem + 1;
        pEStack_40 = pEStack_40 + 1;
      }
    }
  }
  return (ExprList *)db_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListDup(sqlite3 *db, const ExprList *p, int flags){
  ExprList *pNew;
  struct ExprList_item *pItem;
  const struct ExprList_item *pOldItem;
  int i;
  Expr *pPriorSelectColOld = 0;
  Expr *pPriorSelectColNew = 0;
  assert( db!=0 );
  if( p==0 ) return 0;
  pNew = sqlite3DbMallocRawNN(db, sqlite3DbMallocSize(db, p));
  if( pNew==0 ) return 0;
  pNew->nExpr = p->nExpr;
  pNew->nAlloc = p->nAlloc;
  pItem = pNew->a;
  pOldItem = p->a;
  for(i=0; i<p->nExpr; i++, pItem++, pOldItem++){
    Expr *pOldExpr = pOldItem->pExpr;
    Expr *pNewExpr;
    pItem->pExpr = sqlite3ExprDup(db, pOldExpr, flags);
    if( pOldExpr
     && pOldExpr->op==TK_SELECT_COLUMN
     && (pNewExpr = pItem->pExpr)!=0
    ){
      if( pNewExpr->pRight ){
        pPriorSelectColOld = pOldExpr->pRight;
        pPriorSelectColNew = pNewExpr->pRight;
        pNewExpr->pLeft = pNewExpr->pRight;
      }else{
        if( pOldExpr->pLeft!=pPriorSelectColOld ){
          pPriorSelectColOld = pOldExpr->pLeft;
          pPriorSelectColNew = sqlite3ExprDup(db, pPriorSelectColOld, flags);
          pNewExpr->pRight = pPriorSelectColNew;
        }
        pNewExpr->pLeft = pPriorSelectColNew;
      }
    }
    pItem->zEName = sqlite3DbStrDup(db, pOldItem->zEName);
    pItem->fg = pOldItem->fg;
    pItem->fg.done = 0;
    pItem->u = pOldItem->u;
  }
  return pNew;
}